

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_array(cJSON *item,parse_buffer *input_buffer)

{
  cJSON_bool cVar1;
  ulong uVar2;
  cJSON *item_00;
  cJSON *item_01;
  cJSON *pcVar3;
  cJSON *pcVar4;
  
  cVar1 = 0;
  if (input_buffer->depth < 1000) {
    input_buffer->depth = input_buffer->depth + 1;
    if (input_buffer->content[input_buffer->offset] == '[') {
      input_buffer->offset = input_buffer->offset + 1;
      buffer_skip_whitespace(input_buffer);
      uVar2 = input_buffer->offset;
      if (uVar2 < input_buffer->length) {
        if (input_buffer->content[uVar2] == ']') {
          item_01 = (cJSON *)0x0;
        }
        else {
          input_buffer->offset = uVar2 - 1;
          pcVar3 = (cJSON *)0x0;
          pcVar4 = (cJSON *)0x0;
          do {
            item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
            if (item_00 == (cJSON *)0x0) {
              item_01 = pcVar3;
              if (pcVar3 == (cJSON *)0x0) {
                return 0;
              }
              goto LAB_0010593a;
            }
            item_00->valuedouble = 0.0;
            item_00->string = (char *)0x0;
            item_00->valuestring = (char *)0x0;
            *(undefined8 *)&item_00->valueint = 0;
            item_00->child = (cJSON *)0x0;
            *(undefined8 *)&item_00->type = 0;
            item_00->next = (cJSON *)0x0;
            item_00->prev = (cJSON *)0x0;
            item_01 = item_00;
            if (pcVar3 != (cJSON *)0x0) {
              pcVar4->next = item_00;
              item_00->prev = pcVar4;
              item_01 = pcVar3;
            }
            input_buffer->offset = input_buffer->offset + 1;
            buffer_skip_whitespace(input_buffer);
            cVar1 = parse_value(item_00,input_buffer);
            if (cVar1 == 0) goto LAB_0010593a;
            buffer_skip_whitespace(input_buffer);
            uVar2 = input_buffer->offset;
            if (input_buffer->length <= uVar2) goto LAB_0010593a;
            pcVar3 = item_01;
            pcVar4 = item_00;
          } while (input_buffer->content[uVar2] == ',');
          if (input_buffer->content[uVar2] != ']') {
LAB_0010593a:
            cJSON_Delete(item_01);
            return 0;
          }
        }
        input_buffer->depth = input_buffer->depth - 1;
        item->type = 0x20;
        item->child = item_01;
        input_buffer->offset = uVar2 + 1;
        cVar1 = 1;
      }
      else {
        input_buffer->offset = uVar2 - 1;
        cVar1 = 0;
      }
    }
  }
  return cVar1;
}

Assistant:

static cJSON_bool parse_array(cJSON * const item, parse_buffer * const input_buffer)
{
    cJSON *head = NULL; /* head of the linked list */
    cJSON *current_item = NULL;

    if (input_buffer->depth >= CJSON_NESTING_LIMIT)
    {
        return false; /* to deeply nested */
    }
    input_buffer->depth++;

    if (buffer_at_offset(input_buffer)[0] != '[')
    {
        /* not an array */
        goto fail;
    }

    input_buffer->offset++;
    buffer_skip_whitespace(input_buffer);
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == ']'))
    {
        /* empty array */
        goto success;
    }

    /* check if we skipped to the end of the buffer */
    if (cannot_access_at_index(input_buffer, 0))
    {
        input_buffer->offset--;
        goto fail;
    }

    /* step back to character in front of the first element */
    input_buffer->offset--;
    /* loop through the comma separated array elements */
    do
    {
        /* allocate next item */
        cJSON *new_item = cJSON_New_Item(&(input_buffer->hooks));
        if (new_item == NULL)
        {
            goto fail; /* allocation failure */
        }

        /* attach next item to list */
        if (head == NULL)
        {
            /* start the linked list */
            current_item = head = new_item;
        }
        else
        {
            /* add to the end and advance */
            current_item->next = new_item;
            new_item->prev = current_item;
            current_item = new_item;
        }

        /* parse next value */
        input_buffer->offset++;
        buffer_skip_whitespace(input_buffer);
        if (!parse_value(current_item, input_buffer))
        {
            goto fail; /* failed to parse value */
        }
        buffer_skip_whitespace(input_buffer);
    }
    while (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == ','));

    if (cannot_access_at_index(input_buffer, 0) || buffer_at_offset(input_buffer)[0] != ']')
    {
        goto fail; /* expected end of array */
    }

success:
    input_buffer->depth--;

    item->type = cJSON_Array;
    item->child = head;

    input_buffer->offset++;

    return true;

fail:
    if (head != NULL)
    {
        cJSON_Delete(head);
    }

    return false;
}